

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O2

spv_result_t spvtools::val::TypePass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  pointer puVar2;
  pointer ppVar3;
  bool bVar4;
  bool bVar5;
  ushort uVar6;
  int32_t iVar7;
  uint uVar8;
  uint id;
  StorageClass SVar9;
  StorageClass SVar10;
  Instruction *pIVar11;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar12;
  _Base_ptr p_Var13;
  spv_result_t sVar14;
  char *pcVar15;
  Op opcode;
  pointer ppVar16;
  size_t word_i;
  ulong uVar17;
  ulong uVar18;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  built_in_members;
  vector<unsigned_int,_std::allocator<unsigned_int>_> const_inst;
  int64_t length_value;
  Decoration decoration;
  spv_result_t local_38;
  
  iVar7 = spvOpcodeGeneratesType((uint)(inst->inst_).opcode);
  if ((iVar7 == 0) && ((inst->inst_).opcode != 0x27)) {
    return SPV_SUCCESS;
  }
  bVar4 = EnumSet<spvtools::Extension>::contains
                    (&_->module_extensions_,kSPV_VALIDATOR_ignore_type_decl_unique);
  if (bVar4) {
LAB_001c9b13:
    uVar6 = (inst->inst_).opcode;
  }
  else {
    uVar6 = (inst->inst_).opcode;
    if (((0x20 < (ulong)uVar6) || ((0x170000000U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) &&
       (uVar6 != OpTypeUntypedPointerKHR)) {
      bVar4 = ValidationState_t::RegisterUniqueTypeDeclaration(_,inst);
      if (!bVar4) {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&decoration,
                        "Duplicate non-aggregate type declarations are not allowed. Opcode: ");
        pcVar15 = spvOpcodeString((uint)uVar6);
        std::operator<<((ostream *)&decoration,pcVar15);
        std::operator<<((ostream *)&decoration," id: ");
        std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&decoration);
        if (local_38 != SPV_SUCCESS) {
          return local_38;
        }
      }
      goto LAB_001c9b13;
    }
  }
  switch(uVar6) {
  case 0x15:
    uVar8 = Instruction::GetOperandAs<unsigned_int_const>(inst,1);
    switch(uVar8 << 0x1d | uVar8 - 8 >> 3) {
    case 0:
      if ((_->features_).declare_int8_type != false) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar15 = 
      "Using an 8-bit integer type requires the Int8 capability, or an extension that explicitly enables 8-bit integers."
      ;
      break;
    case 1:
      if ((_->features_).declare_int16_type != false) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar15 = 
      "Using a 16-bit integer type requires the Int16 capability, or an extension that explicitly enables 16-bit integers."
      ;
      break;
    default:
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&decoration,"Invalid number of bits (");
      std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
      pcVar15 = ") used for OpTypeInt.";
LAB_001ca849:
      std::operator<<((ostream *)&decoration,pcVar15);
      goto LAB_001cb0b8;
    case 3:
      uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      if (uVar8 < 2) {
        if ((inst->inst_).opcode != 0x15) {
          return SPV_SUCCESS;
        }
        bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel);
        if (!bVar4) {
          return SPV_SUCCESS;
        }
        uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        if (uVar8 == 0) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_BINARY,inst);
        pcVar15 = "The Signedness in OpTypeInt must always be 0 when Kernel capability is used.";
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_VALUE,inst);
        pcVar15 = "OpTypeInt has invalid signedness:";
      }
      break;
    case 7:
      bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityInt64);
      if (bVar4) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar15 = "Using a 64-bit integer type requires the Int64 capability.";
    }
    break;
  case 0x16:
    uVar8 = Instruction::GetOperandAs<unsigned_int_const>(inst,1);
    if (uVar8 == 0x40) {
      bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityFloat64);
      if (bVar4) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&decoration,"Using a 64-bit floating point ");
      pcVar15 = "type requires the Float64 capability.";
    }
    else {
      if (uVar8 == 0x20) {
        return SPV_SUCCESS;
      }
      if (uVar8 == 0x10) {
        if ((_->features_).declare_float16_type != false) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&decoration,"Using a 16-bit floating point ");
        pcVar15 = 
        "type requires the Float16 or Float16Buffer capability, or an extension that explicitly enables 16-bit floating point."
        ;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&decoration,"Invalid number of bits (");
        std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
        pcVar15 = ") used for OpTypeFloat.";
      }
    }
    break;
  case 0x17:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar11 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar11 != (Instruction *)0x0) &&
       (iVar7 = spvOpcodeIsScalarType((uint)(pIVar11->inst_).opcode), iVar7 != 0)) {
      uVar8 = Instruction::GetOperandAs<unsigned_int_const>(inst,2);
      if (uVar8 - 2 < 3) {
        return SPV_SUCCESS;
      }
      if ((uVar8 == 0x10) || (uVar8 == 8)) {
        bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityVector16);
        if (bVar4) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&decoration,"Having ");
        std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
        std::operator<<((ostream *)&decoration," components for ");
        pcVar15 = spvOpcodeString((uint)(inst->inst_).opcode);
        std::operator<<((ostream *)&decoration,pcVar15);
        pcVar15 = " requires the Vector16 capability";
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&decoration,"Illegal number of components (");
        std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
        std::operator<<((ostream *)&decoration,") for ");
        pcVar15 = spvOpcodeString((uint)(inst->inst_).opcode);
      }
      goto LAB_001ca849;
    }
    ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)&decoration,"OpTypeVector Component Type <id> ");
    ValidationState_t::getIdName_abi_cxx11_((string *)&built_in_members,_,uVar8);
    std::operator<<((ostream *)&decoration,(string *)&built_in_members);
    pcVar15 = " is not a scalar type.";
    goto LAB_001caacd;
  case 0x18:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar11 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode != 0x17)) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar15 = "Columns in a matrix must be of type vector.";
    }
    else {
      uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar11,1);
      pIVar11 = ValidationState_t::FindDef(_,uVar8);
      if ((pIVar11->inst_).opcode == 0x16) {
        uVar8 = Instruction::GetOperandAs<unsigned_int_const>(inst,2);
        if (0xfffffffc < uVar8 - 5) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar15 = "Matrix types can only be parameterized as having only 2, 3, or 4 columns.";
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar15 = "Matrix types can only be parameterized with floating-point types.";
      }
    }
    break;
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1f:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
    goto LAB_001cb0c3;
  case 0x1c:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar11 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar11 == (Instruction *)0x0) ||
       (iVar7 = spvOpcodeGeneratesType((uint)(pIVar11->inst_).opcode), iVar7 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar15 = "OpTypeArray Element Type <id> ";
LAB_001caaa1:
      std::operator<<((ostream *)&decoration,pcVar15);
      ValidationState_t::getIdName_abi_cxx11_((string *)&built_in_members,_,uVar8);
      std::operator<<((ostream *)&decoration,(string *)&built_in_members);
      pcVar15 = " is not a type.";
      goto LAB_001caacd;
    }
    if ((pIVar11->inst_).opcode == 0x13) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar15 = "OpTypeArray Element Type <id> ";
LAB_001ca0dc:
      std::operator<<((ostream *)&decoration,pcVar15);
      ValidationState_t::getIdName_abi_cxx11_((string *)&built_in_members,_,uVar8);
      std::operator<<((ostream *)&decoration,(string *)&built_in_members);
      pcVar15 = " is a void type.";
      goto LAB_001caacd;
    }
    bVar4 = spvIsVulkanEnv(_->context_->target_env);
    if ((bVar4) && ((pIVar11->inst_).opcode == 0x1d)) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)&built_in_members,_,0x1248,(char *)0x0);
      std::operator<<((ostream *)&decoration,(string *)&built_in_members);
      pcVar15 = "OpTypeArray Element Type <id> ";
      goto LAB_001caa0a;
    }
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar11 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar11 == (Instruction *)0x0) ||
       (iVar7 = spvOpcodeIsConstant((uint)(pIVar11->inst_).opcode), iVar7 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&decoration,"OpTypeArray Length <id> ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&built_in_members,_,uVar8);
      std::operator<<((ostream *)&decoration,(string *)&built_in_members);
      pcVar15 = " is not a scalar constant type.";
      goto LAB_001ca68b;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&const_inst,&pIVar11->words_);
    pIVar11 = ValidationState_t::FindDef
                        (_,*(uint32_t *)
                            (CONCAT44(const_inst.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)const_inst.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 4));
    if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode != 0x15)) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&decoration,"OpTypeArray Length <id> ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&built_in_members,_,uVar8);
      std::operator<<((ostream *)&decoration,(string *)&built_in_members);
      std::operator<<((ostream *)&decoration," is not a constant integer type.");
LAB_001cb377:
      std::__cxx11::string::_M_dispose();
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&decoration);
      sVar14 = local_38;
    }
    else {
      bVar4 = ValidationState_t::EvalConstantValInt64(_,uVar8,&length_value);
      sVar14 = SPV_SUCCESS;
      if ((bVar4) &&
         ((length_value == 0 ||
          ((length_value < 0 &&
           ((pIVar11->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[3] != 0)))))) {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&decoration,"OpTypeArray Length <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&built_in_members,_,uVar8);
        std::operator<<((ostream *)&decoration,(string *)&built_in_members);
        std::operator<<((ostream *)&decoration," default value must be at least 1: found ");
        std::ostream::_M_insert<long>((long)&decoration);
        goto LAB_001cb377;
      }
    }
    local_38 = sVar14;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&const_inst.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    goto LAB_001cb0bd;
  case 0x1d:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar11 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar11 == (Instruction *)0x0) ||
       (iVar7 = spvOpcodeGeneratesType((uint)(pIVar11->inst_).opcode), iVar7 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar15 = "OpTypeRuntimeArray Element Type <id> ";
      goto LAB_001caaa1;
    }
    if ((pIVar11->inst_).opcode == 0x13) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar15 = "OpTypeRuntimeArray Element Type <id> ";
      goto LAB_001ca0dc;
    }
    bVar4 = spvIsVulkanEnv(_->context_->target_env);
    if (!bVar4) {
      return SPV_SUCCESS;
    }
    if ((pIVar11->inst_).opcode != 0x1d) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
    ValidationState_t::VkErrorID_abi_cxx11_((string *)&built_in_members,_,0x1248,(char *)0x0);
    std::operator<<((ostream *)&decoration,(string *)&built_in_members);
    pcVar15 = "OpTypeRuntimeArray Element Type <id> ";
LAB_001caa0a:
    std::operator<<((ostream *)&decoration,pcVar15);
    ValidationState_t::getIdName_abi_cxx11_((string *)&const_inst,_,uVar8);
    std::operator<<((ostream *)&decoration,(string *)&const_inst);
    std::operator<<((ostream *)&decoration," is not valid in ");
    spvLogStringForEnv_abi_cxx11_((string *)&length_value,_->context_->target_env);
    std::operator<<((ostream *)&decoration,(string *)&length_value);
    std::operator<<((ostream *)&decoration," environments.");
    std::__cxx11::string::_M_dispose();
LAB_001cb41e:
    std::__cxx11::string::_M_dispose();
    goto LAB_001caadc;
  case 0x1e:
    uVar17 = 2;
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    for (uVar18 = 1;
        uVar18 < (ulong)((long)(inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4); uVar18 = uVar18 + 1)
    {
      id = Instruction::GetOperandAs<unsigned_int>(inst,uVar18);
      if (id == (inst->inst_).result_id) {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        pcVar15 = "Structure members may not be self references";
        goto LAB_001cb0a6;
      }
      pIVar11 = ValidationState_t::FindDef(_,id);
      if ((pIVar11 == (Instruction *)0x0) ||
         (iVar7 = spvOpcodeGeneratesType((uint)(pIVar11->inst_).opcode), iVar7 == 0)) {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&decoration,"OpTypeStruct Member Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&built_in_members,_,id);
        std::operator<<((ostream *)&decoration,(string *)&built_in_members);
        pcVar15 = " is not a type.";
        goto LAB_001ca68b;
      }
      uVar1 = (pIVar11->inst_).opcode;
      if (uVar1 == 0x1e) {
        bVar4 = ValidationState_t::IsStructTypeWithBuiltInMember(_,id);
        if (bVar4) {
          ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&decoration,"Structure <id> ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&built_in_members,_,id);
          std::operator<<((ostream *)&decoration,(string *)&built_in_members);
          std::operator<<((ostream *)&decoration,
                          " contains members with BuiltIn decoration. Therefore this ");
          std::operator<<((ostream *)&decoration,
                          "structure may not be contained as a member of another ");
          std::operator<<((ostream *)&decoration,"structure ");
          std::operator<<((ostream *)&decoration,"type. Structure <id> ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&const_inst,_,uVar8);
          std::operator<<((ostream *)&decoration,(string *)&const_inst);
          std::operator<<((ostream *)&decoration," contains structure <id> ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&length_value,_,id);
          std::operator<<((ostream *)&decoration,(string *)&length_value);
          std::operator<<((ostream *)&decoration,".");
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          goto LAB_001ca69e;
        }
      }
      else if (uVar1 == 0x13) {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        pcVar15 = "Structures cannot contain a void type.";
        goto LAB_001cb0a6;
      }
      bVar4 = spvIsVulkanEnv(_->context_->target_env);
      if ((bVar4) && ((pIVar11->inst_).opcode == 0x1d)) {
        if (uVar18 == ((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U) {
          bVar4 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,Block);
          if ((bVar4) ||
             (bVar4 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,BufferBlock), bVar4
             )) goto LAB_001ca1f4;
          ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&built_in_members,_,0x1248,(char *)0x0);
          std::operator<<((ostream *)&decoration,(string *)&built_in_members);
          spvLogStringForEnv_abi_cxx11_((string *)&const_inst,_->context_->target_env);
          std::operator<<((ostream *)&decoration,(string *)&const_inst);
          std::operator<<((ostream *)&decoration,", OpTypeStruct containing an OpTypeRuntimeArray ")
          ;
          pcVar15 = "must be decorated with Block or BufferBlock.";
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&built_in_members,_,0x1248,(char *)0x0);
          std::operator<<((ostream *)&decoration,(string *)&built_in_members);
          std::operator<<((ostream *)&decoration,"In ");
          spvLogStringForEnv_abi_cxx11_((string *)&const_inst,_->context_->target_env);
          std::operator<<((ostream *)&decoration,(string *)&const_inst);
          pcVar15 = ", OpTypeRuntimeArray must only be used for the last member of an OpTypeStruct";
        }
        std::operator<<((ostream *)&decoration,pcVar15);
        goto LAB_001cb41e;
      }
LAB_001ca1f4:
    }
    bVar4 = false;
    for (; puVar2 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
        uVar17 < (ulong)((long)(inst->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2);
        uVar17 = uVar17 + 1) {
      pIVar11 = ValidationState_t::FindDef(_,puVar2[uVar17]);
      if (((pIVar11 != (Instruction *)0x0) && ((pIVar11->inst_).opcode == 0x1e)) &&
         ((bVar5 = ValidationState_t::HasDecoration(_,(pIVar11->inst_).result_id,Block), bVar5 ||
          ((bVar5 = ValidationState_t::HasDecoration(_,(pIVar11->inst_).result_id,BufferBlock),
           bVar5 || (bVar5 = ValidationState_t::GetHasNestedBlockOrBufferBlockStruct
                                       (_,(pIVar11->inst_).result_id), bVar5)))))) {
        bVar4 = true;
      }
    }
    ValidationState_t::SetHasNestedBlockOrBufferBlockStruct(_,(inst->inst_).result_id,bVar4);
    bVar4 = ValidationState_t::GetHasNestedBlockOrBufferBlockStruct(_,(inst->inst_).result_id);
    if ((!bVar4) ||
       ((bVar4 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,BufferBlock), !bVar4 &&
        (bVar4 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,Block), !bVar4)))) {
      built_in_members._M_h._M_buckets = &built_in_members._M_h._M_single_bucket;
      built_in_members._M_h._M_bucket_count = 1;
      built_in_members._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      built_in_members._M_h._M_element_count = 0;
      built_in_members._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      built_in_members._M_h._M_rehash_policy._M_next_resize = 0;
      built_in_members._M_h._M_single_bucket = (__node_base_ptr)0x0;
      psVar12 = ValidationState_t::id_decorations(_,uVar8);
      for (p_Var13 = (psVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var13 != &(psVar12->_M_t)._M_impl.super__Rb_tree_header;
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
        Decoration::Decoration(&decoration,(Decoration *)(p_Var13 + 1));
        if ((decoration.dec_type_ == BuiltIn) && (decoration.struct_member_index_ != -1)) {
          const_inst.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = decoration.struct_member_index_;
          std::__detail::
          _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                    *)&built_in_members,(value_type *)&const_inst);
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&decoration.params_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      }
      if (((int)built_in_members._M_h._M_element_count < 1) ||
         ((int)((ulong)((long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1 ==
          (int)built_in_members._M_h._M_element_count)) {
        if (0 < (int)built_in_members._M_h._M_element_count) {
          ValidationState_t::RegisterStructTypeWithBuiltInMember(_,uVar8);
        }
        bVar4 = spvIsVulkanEnv(_->context_->target_env);
        sVar14 = SPV_SUCCESS;
        if ((bVar4) && (_->options_->before_hlsl_legalization == false)) {
          decoration.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          decoration.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_type.cpp:383:29)>
                        ::_M_invoke;
          decoration.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish =
               (pointer)std::
                        _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_type.cpp:383:29)>
                        ::_M_manager;
          decoration._0_8_ = _;
          bVar4 = ValidationState_t::ContainsType
                            (_,(inst->inst_).result_id,
                             (function<bool_(const_spvtools::val::Instruction_*)> *)&decoration,true
                            );
          if (decoration.params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            (*(code *)decoration.params_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish)(&decoration,&decoration,3);
          }
          if (bVar4) {
            ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
            ValidationState_t::VkErrorID_abi_cxx11_((string *)&const_inst,_,0x123b,(char *)0x0);
            std::operator<<((ostream *)&decoration,(string *)&const_inst);
            std::operator<<((ostream *)&decoration,"In ");
            spvLogStringForEnv_abi_cxx11_((string *)&length_value,_->context_->target_env);
            std::operator<<((ostream *)&decoration,(string *)&length_value);
            std::operator<<((ostream *)&decoration,", OpTypeStruct must not contain an opaque type."
                           );
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            goto LAB_001cad92;
          }
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&decoration,
                        "When BuiltIn decoration is applied to a structure-type member, ");
        std::operator<<((ostream *)&decoration,
                        "all members of that structure type must also be decorated with ");
        std::operator<<((ostream *)&decoration,
                        "BuiltIn (No allowed mixing of built-in variables and ");
        std::operator<<((ostream *)&decoration,
                        "non-built-in variables within a single structure). Structure id ");
        std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
        std::operator<<((ostream *)&decoration," does not meet this requirement.");
LAB_001cad92:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&decoration);
        sVar14 = local_38;
      }
      local_38 = sVar14;
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&built_in_members._M_h);
      goto LAB_001cb0bd;
    }
    ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
    pcVar15 = "rules: A Block or BufferBlock cannot be nested within another Block or BufferBlock. "
    ;
    break;
  case 0x20:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar11 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar11 == (Instruction *)0x0) ||
       (iVar7 = spvOpcodeGeneratesType((uint)(pIVar11->inst_).opcode), iVar7 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar15 = "OpTypePointer Type <id> ";
      goto LAB_001caaa1;
    }
    SVar10 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
    if (SVar10 == StorageClassUniformConstant) {
      uVar6 = (pIVar11->inst_).opcode;
      if ((uVar6 & 0xfffe) == 0x1c) {
        uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar11,1);
        pIVar11 = ValidationState_t::FindDef(_,uVar8);
        uVar6 = (pIVar11->inst_).opcode;
      }
      if ((uVar6 == 0x19) &&
         (uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar11,6), uVar8 == 2)) {
        ValidationState_t::RegisterPointerToStorageImage(_,(inst->inst_).result_id);
      }
    }
    bVar4 = ValidationState_t::IsValidStorageClass(_,SVar10);
    if (bVar4) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_BINARY,inst);
    ValidationState_t::VkErrorID_abi_cxx11_((string *)&built_in_members,_,0x1223,(char *)0x0);
    std::operator<<((ostream *)&decoration,(string *)&built_in_members);
    pcVar15 = "Invalid storage class for target environment";
LAB_001caacd:
    std::operator<<((ostream *)&decoration,pcVar15);
LAB_001caadc:
    std::__cxx11::string::_M_dispose();
    goto LAB_001cb0b8;
  case 0x21:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar11 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar11 == (Instruction *)0x0) ||
       (iVar7 = spvOpcodeGeneratesType((uint)(pIVar11->inst_).opcode), iVar7 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar15 = "OpTypeFunction Return Type <id> ";
      goto LAB_001caaa1;
    }
    for (uVar18 = 0;
        uVar18 + 2 <
        (ulong)((long)(inst->operands_).
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(inst->operands_).
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4); uVar18 = uVar18 + 1) {
      uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,uVar18 + 2);
      pIVar11 = ValidationState_t::FindDef(_,uVar8);
      if ((pIVar11 == (Instruction *)0x0) ||
         (iVar7 = spvOpcodeGeneratesType((uint)(pIVar11->inst_).opcode), iVar7 == 0)) {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        pcVar15 = "OpTypeFunction Parameter Type <id> ";
        goto LAB_001caaa1;
      }
      if ((pIVar11->inst_).opcode == 0x13) {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&decoration,"OpTypeFunction Parameter Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&built_in_members,_,uVar8);
        std::operator<<((ostream *)&decoration,(string *)&built_in_members);
        pcVar15 = " cannot be OpTypeVoid.";
        goto LAB_001caacd;
      }
    }
    if ((_->options_->universal_limits_).max_function_args < uVar18) {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&decoration,"OpTypeFunction may not take more than ");
      std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
      std::operator<<((ostream *)&decoration," arguments. OpTypeFunction <id> ");
      uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,0);
      ValidationState_t::getIdName_abi_cxx11_((string *)&built_in_members,_,uVar8);
      std::operator<<((ostream *)&decoration,(string *)&built_in_members);
      std::operator<<((ostream *)&decoration," has ");
      std::ostream::_M_insert<unsigned_long>((ulong)&decoration);
      pcVar15 = " arguments.";
    }
    else {
      ppVar16 = (inst->uses_).
                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (inst->uses_).
               super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (ppVar16 == ppVar3) {
          return SPV_SUCCESS;
        }
        pIVar11 = ppVar16->first;
        opcode = (Op)(pIVar11->inst_).opcode;
        if ((((opcode != OpFunction) && (bVar4 = spvOpcodeIsDebug(opcode), !bVar4)) &&
            (bVar4 = Instruction::IsNonSemantic(pIVar11), !bVar4)) &&
           (bVar4 = spvOpcodeIsDecoration((uint)(pIVar11->inst_).opcode), !bVar4)) break;
        ppVar16 = ppVar16 + 1;
      }
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,pIVar11);
      std::operator<<((ostream *)&decoration,"Invalid use of function type result id ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&built_in_members,_,(inst->inst_).result_id)
      ;
      std::operator<<((ostream *)&decoration,(string *)&built_in_members);
      pcVar15 = ".";
    }
LAB_001ca68b:
    std::operator<<((ostream *)&decoration,pcVar15);
LAB_001ca69e:
    std::__cxx11::string::_M_dispose();
    goto LAB_001cb0b8;
  case 0x27:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar11 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar11->inst_).opcode == 0x20) {
      SVar10 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
      SVar9 = Instruction::GetOperandAs<spv::StorageClass>(pIVar11,1);
      if (SVar10 == SVar9) {
        uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar11,2);
        pIVar11 = ValidationState_t::FindDef(_,uVar8);
        if ((pIVar11 != (Instruction *)0x0) && ((pIVar11->inst_).opcode == 0x1e)) {
          bVar4 = spvIsVulkanEnv(_->context_->target_env);
          if (SVar10 == PhysicalStorageBuffer) {
            return SPV_SUCCESS;
          }
          if (!bVar4) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&built_in_members,_,0x1267,(char *)0x0);
          std::operator<<((ostream *)&decoration,(string *)&built_in_members);
          std::operator<<((ostream *)&decoration,"In Vulkan, OpTypeForwardPointer must have ");
          pcVar15 = "a storage class of PhysicalStorageBuffer.";
          goto LAB_001caacd;
        }
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        pcVar15 = "Forward pointers must point to a structure";
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&decoration,
                        "Storage class in OpTypeForwardPointer does not match the ");
        pcVar15 = "pointer definition.";
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar15 = "Pointer type in OpTypeForwardPointer is not a pointer type.";
    }
    break;
  default:
    if (uVar6 != 0x1141) {
      if ((uVar6 != 0x1168) && (uVar6 != 0x14ee)) {
        return SPV_SUCCESS;
      }
      uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      pIVar11 = ValidationState_t::FindDef(_,uVar8);
      if ((pIVar11 == (Instruction *)0x0) || (1 < (pIVar11->inst_).opcode - 0x15)) {
        ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&decoration,"OpTypeCooperativeMatrix Component Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&built_in_members,_,uVar8);
        std::operator<<((ostream *)&decoration,(string *)&built_in_members);
        pcVar15 = " is not a scalar numerical type.";
      }
      else {
        uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        pIVar11 = ValidationState_t::FindDef(_,uVar8);
        if (((pIVar11 == (Instruction *)0x0) ||
            (bVar4 = ValidationState_t::IsIntScalarType(_,(pIVar11->inst_).type_id), !bVar4)) ||
           (iVar7 = spvOpcodeIsConstant((uint)(pIVar11->inst_).opcode), iVar7 == 0)) {
          ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
          pcVar15 = "OpTypeCooperativeMatrix Scope <id> ";
        }
        else {
          uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,3);
          pIVar11 = ValidationState_t::FindDef(_,uVar8);
          if (((pIVar11 == (Instruction *)0x0) ||
              (bVar4 = ValidationState_t::IsIntScalarType(_,(pIVar11->inst_).type_id), !bVar4)) ||
             (iVar7 = spvOpcodeIsConstant((uint)(pIVar11->inst_).opcode), iVar7 == 0)) {
            ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
            pcVar15 = "OpTypeCooperativeMatrix Rows <id> ";
          }
          else {
            uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,4);
            pIVar11 = ValidationState_t::FindDef(_,uVar8);
            if (((pIVar11 == (Instruction *)0x0) ||
                (bVar4 = ValidationState_t::IsIntScalarType(_,(pIVar11->inst_).type_id), !bVar4)) ||
               (iVar7 = spvOpcodeIsConstant((uint)(pIVar11->inst_).opcode), iVar7 == 0)) {
              ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
              pcVar15 = "OpTypeCooperativeMatrix Cols <id> ";
            }
            else {
              if ((inst->inst_).opcode != 0x1168) {
                return SPV_SUCCESS;
              }
              uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,5);
              pIVar11 = ValidationState_t::FindDef(_,uVar8);
              if (((pIVar11 != (Instruction *)0x0) &&
                  (bVar4 = ValidationState_t::IsIntScalarType(_,(pIVar11->inst_).type_id), bVar4))
                 && (iVar7 = spvOpcodeIsConstant((uint)(pIVar11->inst_).opcode), iVar7 != 0)) {
                return SPV_SUCCESS;
              }
              ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
              pcVar15 = "OpTypeCooperativeMatrixKHR Use <id> ";
            }
          }
        }
        std::operator<<((ostream *)&decoration,pcVar15);
        ValidationState_t::getIdName_abi_cxx11_((string *)&built_in_members,_,uVar8);
        std::operator<<((ostream *)&decoration,(string *)&built_in_members);
        pcVar15 = " is not a constant instruction with scalar integer type.";
      }
      goto LAB_001caacd;
    }
    bVar4 = spvIsVulkanEnv(_->context_->target_env);
    if (!bVar4) {
      return SPV_SUCCESS;
    }
    SVar10 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
    if (SVar10 == StorageClassUniform) {
      return SPV_SUCCESS;
    }
    if (SVar10 == PhysicalStorageBuffer) {
      return SPV_SUCCESS;
    }
    if (SVar10 == PushConstant) {
      return SPV_SUCCESS;
    }
    if (SVar10 == StorageBuffer) {
      return SPV_SUCCESS;
    }
    if (SVar10 == StorageClassWorkgroup) {
      bVar4 = EnumSet<spv::Capability>::contains
                        (&_->module_capabilities_,CapabilityWorkgroupMemoryExplicitLayoutKHR);
      if (bVar4) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar15 = 
      "Workgroup storage class untyped pointers in Vulkan require WorkgroupMemoryExplicitLayoutKHR be declared"
      ;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)&decoration,_,SPV_ERROR_INVALID_ID,inst);
      pcVar15 = 
      "In Vulkan, untyped pointers can only be used in an explicitly laid out storage class";
    }
  }
LAB_001cb0a6:
  std::operator<<((ostream *)&decoration,pcVar15);
LAB_001cb0b8:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&decoration);
LAB_001cb0bd:
  if (local_38 != SPV_SUCCESS) {
    return local_38;
  }
LAB_001cb0c3:
  return SPV_SUCCESS;
}

Assistant:

spv_result_t TypePass(ValidationState_t& _, const Instruction* inst) {
  if (!spvOpcodeGeneratesType(inst->opcode()) &&
      inst->opcode() != spv::Op::OpTypeForwardPointer) {
    return SPV_SUCCESS;
  }

  if (auto error = ValidateUniqueness(_, inst)) return error;

  switch (inst->opcode()) {
    case spv::Op::OpTypeInt:
      if (auto error = ValidateTypeInt(_, inst)) return error;
      break;
    case spv::Op::OpTypeFloat:
      if (auto error = ValidateTypeFloat(_, inst)) return error;
      break;
    case spv::Op::OpTypeVector:
      if (auto error = ValidateTypeVector(_, inst)) return error;
      break;
    case spv::Op::OpTypeMatrix:
      if (auto error = ValidateTypeMatrix(_, inst)) return error;
      break;
    case spv::Op::OpTypeArray:
      if (auto error = ValidateTypeArray(_, inst)) return error;
      break;
    case spv::Op::OpTypeRuntimeArray:
      if (auto error = ValidateTypeRuntimeArray(_, inst)) return error;
      break;
    case spv::Op::OpTypeStruct:
      if (auto error = ValidateTypeStruct(_, inst)) return error;
      break;
    case spv::Op::OpTypePointer:
      if (auto error = ValidateTypePointer(_, inst)) return error;
      break;
    case spv::Op::OpTypeFunction:
      if (auto error = ValidateTypeFunction(_, inst)) return error;
      break;
    case spv::Op::OpTypeForwardPointer:
      if (auto error = ValidateTypeForwardPointer(_, inst)) return error;
      break;
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      if (auto error = ValidateTypeCooperativeMatrix(_, inst)) return error;
      break;
    case spv::Op::OpTypeUntypedPointerKHR:
      if (auto error = ValidateTypeUntypedPointerKHR(_, inst)) return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}